

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

string * __thiscall COutPoint::ToString_abi_cxx11_(COutPoint *this)

{
  char *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  transaction_identifier<false> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  uint *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  char *fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = local_48;
  fmt = in_RSI;
  transaction_identifier<false>::ToString_abi_cxx11_(in_stack_ffffffffffffff70);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (this_00,(size_type)in_RSI,(size_type)in_RDI);
  tinyformat::format<std::__cxx11::string,unsigned_int>
            (fmt,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string COutPoint::ToString() const
{
    return strprintf("COutPoint(%s, %u)", hash.ToString().substr(0,10), n);
}